

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void caffe::protobuf_caffe_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<caffe::BlobShape>::Shutdown
            ((ExplicitlyConstructed<caffe::BlobShape> *)_BlobShape_default_instance_);
  if (_DAT_00da0548 != (long *)0x0) {
    (**(code **)(*_DAT_00da0548 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::BlobProto>::Shutdown
            ((ExplicitlyConstructed<caffe::BlobProto> *)_BlobProto_default_instance_);
  if (_DAT_00da0558 != (long *)0x0) {
    (**(code **)(*_DAT_00da0558 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::BlobProtoVector>::Shutdown
            ((ExplicitlyConstructed<caffe::BlobProtoVector> *)_BlobProtoVector_default_instance_);
  if (_DAT_00da0568 != (long *)0x0) {
    (**(code **)(*_DAT_00da0568 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::Datum>::Shutdown
            ((ExplicitlyConstructed<caffe::Datum> *)_Datum_default_instance_);
  if (_DAT_00da0578 != (long *)0x0) {
    (**(code **)(*_DAT_00da0578 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::FillerParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::FillerParameter> *)_FillerParameter_default_instance_);
  if (_DAT_00da0588 != (long *)0x0) {
    (**(code **)(*_DAT_00da0588 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)FillerParameter::_default_type__abi_cxx11_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::NetParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::NetParameter> *)_NetParameter_default_instance_);
  if (_DAT_00da0598 != (long *)0x0) {
    (**(code **)(*_DAT_00da0598 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::SolverParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::SolverParameter> *)_SolverParameter_default_instance_);
  if (_DAT_00da05a8 != (long *)0x0) {
    (**(code **)(*_DAT_00da05a8 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)SolverParameter::_default_regularization_type__abi_cxx11_);
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)SolverParameter::_default_type__abi_cxx11_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SolverState>::Shutdown
            ((ExplicitlyConstructed<caffe::SolverState> *)_SolverState_default_instance_);
  if (_DAT_00da05b8 != (long *)0x0) {
    (**(code **)(*_DAT_00da05b8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::NetState>::Shutdown
            ((ExplicitlyConstructed<caffe::NetState> *)_NetState_default_instance_);
  if (_DAT_00da05c8 != (long *)0x0) {
    (**(code **)(*_DAT_00da05c8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::NetStateRule>::Shutdown
            ((ExplicitlyConstructed<caffe::NetStateRule> *)_NetStateRule_default_instance_);
  if (_DAT_00da05d8 != (long *)0x0) {
    (**(code **)(*_DAT_00da05d8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ParamSpec>::Shutdown
            ((ExplicitlyConstructed<caffe::ParamSpec> *)_ParamSpec_default_instance_);
  if (_DAT_00da05e8 != (long *)0x0) {
    (**(code **)(*_DAT_00da05e8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::LayerParameter> *)_LayerParameter_default_instance_);
  if (_DAT_00da05f8 != (long *)0x0) {
    (**(code **)(*_DAT_00da05f8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::TransformationParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::TransformationParameter> *)
             _TransformationParameter_default_instance_);
  if (_DAT_00da0608 != (long *)0x0) {
    (**(code **)(*_DAT_00da0608 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::LossParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::LossParameter> *)_LossParameter_default_instance_);
  if (_DAT_00da0618 != (long *)0x0) {
    (**(code **)(*_DAT_00da0618 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::AccuracyParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::AccuracyParameter> *)_AccuracyParameter_default_instance_
            );
  if (_DAT_00da0628 != (long *)0x0) {
    (**(code **)(*_DAT_00da0628 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ArgMaxParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ArgMaxParameter> *)_ArgMaxParameter_default_instance_);
  if (_DAT_00da0638 != (long *)0x0) {
    (**(code **)(*_DAT_00da0638 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ConcatParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ConcatParameter> *)_ConcatParameter_default_instance_);
  if (_DAT_00da0648 != (long *)0x0) {
    (**(code **)(*_DAT_00da0648 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::BatchNormParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::BatchNormParameter> *)
             _BatchNormParameter_default_instance_);
  if (_DAT_00da0658 != (long *)0x0) {
    (**(code **)(*_DAT_00da0658 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::BiasParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::BiasParameter> *)_BiasParameter_default_instance_);
  if (_DAT_00da0668 != (long *)0x0) {
    (**(code **)(*_DAT_00da0668 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ContrastiveLossParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ContrastiveLossParameter> *)
             _ContrastiveLossParameter_default_instance_);
  if (_DAT_00da0678 != (long *)0x0) {
    (**(code **)(*_DAT_00da0678 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ConvolutionParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ConvolutionParameter> *)
             _ConvolutionParameter_default_instance_);
  if (_DAT_00da0688 != (long *)0x0) {
    (**(code **)(*_DAT_00da0688 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::CropParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::CropParameter> *)_CropParameter_default_instance_);
  if (_DAT_00da0698 != (long *)0x0) {
    (**(code **)(*_DAT_00da0698 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::DataParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::DataParameter> *)_DataParameter_default_instance_);
  if (_DAT_00da06a8 != (long *)0x0) {
    (**(code **)(*_DAT_00da06a8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::DropoutParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::DropoutParameter> *)_DropoutParameter_default_instance_);
  if (_DAT_00da06b8 != (long *)0x0) {
    (**(code **)(*_DAT_00da06b8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::DummyDataParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::DummyDataParameter> *)
             _DummyDataParameter_default_instance_);
  if (_DAT_00da06c8 != (long *)0x0) {
    (**(code **)(*_DAT_00da06c8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::EltwiseParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::EltwiseParameter> *)_EltwiseParameter_default_instance_);
  if (_DAT_00da06d8 != (long *)0x0) {
    (**(code **)(*_DAT_00da06d8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ELUParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ELUParameter> *)_ELUParameter_default_instance_);
  if (_DAT_00da06e8 != (long *)0x0) {
    (**(code **)(*_DAT_00da06e8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::EmbedParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::EmbedParameter> *)_EmbedParameter_default_instance_);
  if (_DAT_00da06f8 != (long *)0x0) {
    (**(code **)(*_DAT_00da06f8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ExpParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ExpParameter> *)_ExpParameter_default_instance_);
  if (_DAT_00da0708 != (long *)0x0) {
    (**(code **)(*_DAT_00da0708 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::FlattenParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::FlattenParameter> *)_FlattenParameter_default_instance_);
  if (_DAT_00da0718 != (long *)0x0) {
    (**(code **)(*_DAT_00da0718 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::HDF5DataParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::HDF5DataParameter> *)_HDF5DataParameter_default_instance_
            );
  if (_DAT_00da0728 != (long *)0x0) {
    (**(code **)(*_DAT_00da0728 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::HDF5OutputParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::HDF5OutputParameter> *)
             _HDF5OutputParameter_default_instance_);
  if (_DAT_00da0738 != (long *)0x0) {
    (**(code **)(*_DAT_00da0738 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::HingeLossParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::HingeLossParameter> *)
             _HingeLossParameter_default_instance_);
  if (_DAT_00da0748 != (long *)0x0) {
    (**(code **)(*_DAT_00da0748 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ImageDataParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ImageDataParameter> *)
             _ImageDataParameter_default_instance_);
  if (_DAT_00da0758 != (long *)0x0) {
    (**(code **)(*_DAT_00da0758 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::InfogainLossParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::InfogainLossParameter> *)
             _InfogainLossParameter_default_instance_);
  if (_DAT_00da0768 != (long *)0x0) {
    (**(code **)(*_DAT_00da0768 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::InnerProductParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::InnerProductParameter> *)
             _InnerProductParameter_default_instance_);
  if (_DAT_00da0778 != (long *)0x0) {
    (**(code **)(*_DAT_00da0778 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::InputParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::InputParameter> *)_InputParameter_default_instance_);
  if (_DAT_00da0788 != (long *)0x0) {
    (**(code **)(*_DAT_00da0788 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::LogParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::LogParameter> *)_LogParameter_default_instance_);
  if (_DAT_00da0798 != (long *)0x0) {
    (**(code **)(*_DAT_00da0798 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::LRNParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::LRNParameter> *)_LRNParameter_default_instance_);
  if (_DAT_00da07a8 != (long *)0x0) {
    (**(code **)(*_DAT_00da07a8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::MemoryDataParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::MemoryDataParameter> *)
             _MemoryDataParameter_default_instance_);
  if (_DAT_00da07b8 != (long *)0x0) {
    (**(code **)(*_DAT_00da07b8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::MVNParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::MVNParameter> *)_MVNParameter_default_instance_);
  if (_DAT_00da07c8 != (long *)0x0) {
    (**(code **)(*_DAT_00da07c8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ParameterParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ParameterParameter> *)
             _ParameterParameter_default_instance_);
  if (_DAT_00da07d8 != (long *)0x0) {
    (**(code **)(*_DAT_00da07d8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::PoolingParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::PoolingParameter> *)_PoolingParameter_default_instance_);
  if (_DAT_00da07e8 != (long *)0x0) {
    (**(code **)(*_DAT_00da07e8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::PowerParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::PowerParameter> *)_PowerParameter_default_instance_);
  if (_DAT_00da07f8 != (long *)0x0) {
    (**(code **)(*_DAT_00da07f8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::PythonParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::PythonParameter> *)_PythonParameter_default_instance_);
  if (_DAT_00da0808 != (long *)0x0) {
    (**(code **)(*_DAT_00da0808 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::RecurrentParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::RecurrentParameter> *)
             _RecurrentParameter_default_instance_);
  if (_DAT_00da0818 != (long *)0x0) {
    (**(code **)(*_DAT_00da0818 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ReductionParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ReductionParameter> *)
             _ReductionParameter_default_instance_);
  if (_DAT_00da0828 != (long *)0x0) {
    (**(code **)(*_DAT_00da0828 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ReLUParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ReLUParameter> *)_ReLUParameter_default_instance_);
  if (_DAT_00da0838 != (long *)0x0) {
    (**(code **)(*_DAT_00da0838 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ReshapeParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ReshapeParameter> *)_ReshapeParameter_default_instance_);
  if (_DAT_00da0848 != (long *)0x0) {
    (**(code **)(*_DAT_00da0848 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ScaleParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ScaleParameter> *)_ScaleParameter_default_instance_);
  if (_DAT_00da0858 != (long *)0x0) {
    (**(code **)(*_DAT_00da0858 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::SigmoidParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::SigmoidParameter> *)_SigmoidParameter_default_instance_);
  if (_DAT_00da0868 != (long *)0x0) {
    (**(code **)(*_DAT_00da0868 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::SliceParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::SliceParameter> *)_SliceParameter_default_instance_);
  if (_DAT_00da0878 != (long *)0x0) {
    (**(code **)(*_DAT_00da0878 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::SoftmaxParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::SoftmaxParameter> *)_SoftmaxParameter_default_instance_);
  if (_DAT_00da0888 != (long *)0x0) {
    (**(code **)(*_DAT_00da0888 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::TanHParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::TanHParameter> *)_TanHParameter_default_instance_);
  if (_DAT_00da0898 != (long *)0x0) {
    (**(code **)(*_DAT_00da0898 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::TileParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::TileParameter> *)_TileParameter_default_instance_);
  if (_DAT_00da08a8 != (long *)0x0) {
    (**(code **)(*_DAT_00da08a8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::ThresholdParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::ThresholdParameter> *)
             _ThresholdParameter_default_instance_);
  if (_DAT_00da08b8 != (long *)0x0) {
    (**(code **)(*_DAT_00da08b8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::WindowDataParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::WindowDataParameter> *)
             _WindowDataParameter_default_instance_);
  if (_DAT_00da08c8 != (long *)0x0) {
    (**(code **)(*_DAT_00da08c8 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)WindowDataParameter::_default_crop_mode__abi_cxx11_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SPPParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::SPPParameter> *)_SPPParameter_default_instance_);
  if (_DAT_00da08d8 != (long *)0x0) {
    (**(code **)(*_DAT_00da08d8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::V1LayerParameter> *)_V1LayerParameter_default_instance_);
  if (_DAT_00da08e8 != (long *)0x0) {
    (**(code **)(*_DAT_00da08e8 + 8))();
  }
  google::protobuf::internal::ExplicitlyConstructed<caffe::V0LayerParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::V0LayerParameter> *)_V0LayerParameter_default_instance_);
  if (_DAT_00da08f8 != (long *)0x0) {
    (**(code **)(*_DAT_00da08f8 + 8))();
  }
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Shutdown((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)V0LayerParameter::_default_det_crop_mode__abi_cxx11_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::PReLUParameter>::Shutdown
            ((ExplicitlyConstructed<caffe::PReLUParameter> *)_PReLUParameter_default_instance_);
  if (_DAT_00da0908 != (long *)0x0) {
    (**(code **)(*_DAT_00da0908 + 8))();
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _BlobShape_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _BlobProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _BlobProtoVector_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _Datum_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _FillerParameter_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  FillerParameter::_default_type_.Shutdown();
  _NetParameter_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _SolverParameter_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  SolverParameter::_default_regularization_type_.Shutdown();
  SolverParameter::_default_type_.Shutdown();
  _SolverState_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _NetState_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _NetStateRule_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _ParamSpec_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _TransformationParameter_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _LossParameter_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _AccuracyParameter_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _ArgMaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _ConcatParameter_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _BatchNormParameter_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _BiasParameter_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _ContrastiveLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _ConvolutionParameter_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _CropParameter_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _DropoutParameter_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _DummyDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
  _EltwiseParameter_default_instance_.Shutdown();
  delete file_level_metadata[25].reflection;
  _ELUParameter_default_instance_.Shutdown();
  delete file_level_metadata[26].reflection;
  _EmbedParameter_default_instance_.Shutdown();
  delete file_level_metadata[27].reflection;
  _ExpParameter_default_instance_.Shutdown();
  delete file_level_metadata[28].reflection;
  _FlattenParameter_default_instance_.Shutdown();
  delete file_level_metadata[29].reflection;
  _HDF5DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[30].reflection;
  _HDF5OutputParameter_default_instance_.Shutdown();
  delete file_level_metadata[31].reflection;
  _HingeLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[32].reflection;
  _ImageDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[33].reflection;
  _InfogainLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[34].reflection;
  _InnerProductParameter_default_instance_.Shutdown();
  delete file_level_metadata[35].reflection;
  _InputParameter_default_instance_.Shutdown();
  delete file_level_metadata[36].reflection;
  _LogParameter_default_instance_.Shutdown();
  delete file_level_metadata[37].reflection;
  _LRNParameter_default_instance_.Shutdown();
  delete file_level_metadata[38].reflection;
  _MemoryDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[39].reflection;
  _MVNParameter_default_instance_.Shutdown();
  delete file_level_metadata[40].reflection;
  _ParameterParameter_default_instance_.Shutdown();
  delete file_level_metadata[41].reflection;
  _PoolingParameter_default_instance_.Shutdown();
  delete file_level_metadata[42].reflection;
  _PowerParameter_default_instance_.Shutdown();
  delete file_level_metadata[43].reflection;
  _PythonParameter_default_instance_.Shutdown();
  delete file_level_metadata[44].reflection;
  _RecurrentParameter_default_instance_.Shutdown();
  delete file_level_metadata[45].reflection;
  _ReductionParameter_default_instance_.Shutdown();
  delete file_level_metadata[46].reflection;
  _ReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[47].reflection;
  _ReshapeParameter_default_instance_.Shutdown();
  delete file_level_metadata[48].reflection;
  _ScaleParameter_default_instance_.Shutdown();
  delete file_level_metadata[49].reflection;
  _SigmoidParameter_default_instance_.Shutdown();
  delete file_level_metadata[50].reflection;
  _SliceParameter_default_instance_.Shutdown();
  delete file_level_metadata[51].reflection;
  _SoftmaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[52].reflection;
  _TanHParameter_default_instance_.Shutdown();
  delete file_level_metadata[53].reflection;
  _TileParameter_default_instance_.Shutdown();
  delete file_level_metadata[54].reflection;
  _ThresholdParameter_default_instance_.Shutdown();
  delete file_level_metadata[55].reflection;
  _WindowDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[56].reflection;
  WindowDataParameter::_default_crop_mode_.Shutdown();
  _SPPParameter_default_instance_.Shutdown();
  delete file_level_metadata[57].reflection;
  _V1LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[58].reflection;
  _V0LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[59].reflection;
  V0LayerParameter::_default_det_crop_mode_.Shutdown();
  _PReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[60].reflection;
}